

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::GetSpectrumArray
          (ParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  bool bVar1;
  const_iterator ppPVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *s;
  SpectrumType in_stack_000001f4;
  ParsedParameter *in_stack_000001f8;
  ParameterDictionary *in_stack_00000200;
  Allocator in_stack_00000208;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar3;
  const_iterator local_38;
  
  this_00 = in_RDI;
  local_38 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RSI);
  ppPVar2 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::end(this_00);
  do {
    if (local_38 == ppPVar2) {
      memset(in_RDI,0,0x18);
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)0x74f5e6);
      return (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)this_00;
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_RDI);
    if (!bVar1) {
      extractSpectrumArray(in_stack_00000200,in_stack_000001f8,in_stack_000001f4,in_stack_00000208);
      bVar1 = std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::empty
                        ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      uVar3 = (uint)!bVar1;
      if (bVar1) {
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~vector
                  ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                   (ulong)CONCAT14(!bVar1,in_stack_ffffffffffffffa0));
      }
      if (uVar3 != 0) {
        return (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)this_00;
      }
      in_stack_ffffffffffffffa4 = 0;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::GetSpectrumArray(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<SpectrumHandle> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty())
            return s;
    }
    return {};
}